

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void __thiscall cs::domain_type::domain_type(domain_type *this)

{
  domain_type **in_RDI;
  domain_type **__args;
  
  __args = in_RDI;
  phmap::
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::flat_hash_map((flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)0x1787a0);
  std::make_shared<cs::domain_ref,cs::domain_type*>(__args);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)0x1787cb);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  return;
}

Assistant:

domain_type() : m_ref(std::make_shared<domain_ref>(this)) {}